

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O3

bool __thiscall QAccessibleTabButton::isValid(QAccessibleTabButton *this)

{
  Data *pDVar1;
  QObject *this_00;
  bool bVar2;
  int iVar3;
  
  pDVar1 = (this->m_parent).wp.d;
  if (pDVar1 != (Data *)0x0) {
    this_00 = (this->m_parent).wp.value;
    if ((this_00 == (QObject *)0x0 || *(int *)(pDVar1 + 4) == 0) ||
       ((*(byte *)(*(long *)(this_00 + 8) + 0x1c2) & 4) != 0)) {
      bVar2 = false;
    }
    else {
      iVar3 = QTabBar::count((QTabBar *)this_00);
      bVar2 = this->m_index < iVar3;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool isNull() const noexcept { return d == nullptr || d->strongref.loadRelaxed() == 0 || value == nullptr; }